

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *this)

{
  bool bVar1;
  reference pcVar2;
  ostream *poVar3;
  undefined8 uVar4;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  string *result;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  string local_1f8 [39];
  char local_1d1;
  int local_1d0;
  stringstream local_1c0 [16];
  ostream local_1b0 [383];
  char local_31;
  char *local_30;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = in_RSI + 0x20;
  local_28._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffdb8);
  local_30 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffdb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffdc0,
                            (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffdb8), bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_28);
    local_31 = *pcVar2;
    if ((local_31 < '\0') || ('\x1f' < local_31)) {
      std::__cxx11::string::push_back((char)in_RDI);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar3 = std::operator<<(local_1b0,"<U+");
      local_1d0 = (int)std::setw(4);
      poVar3 = std::operator<<(poVar3,(_Setw)local_1d0);
      uVar4 = std::ostream::operator<<(poVar3,std::uppercase);
      local_1d1 = (char)std::setfill<char>('0');
      poVar3 = std::operator<<(uVar4,local_1d1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      in_stack_fffffffffffffdc0 = (ostream *)std::ostream::operator<<(poVar3,(int)local_31);
      std::operator<<(in_stack_fffffffffffffdc0,">");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)in_RDI,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream(local_1c0);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

std::string get_token_string() const
{
// escape control characters
std::string result;
for (const auto c : token_string)
{
if ('\x00' <= c and c <= '\x1F')
{
// escape control characters
std::stringstream ss;
ss << "<U+" << std::setw(4) << std::uppercase << std::setfill('0')
<< std::hex << static_cast<int>(c) << ">";
result += ss.str();
}
else
{
// add character as is
result.push_back(c);
}
}

return result;
}